

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O2

void p2sc_free_keyfile(p2sc_keyfile_t *k)

{
  if (k != (p2sc_keyfile_t *)0x0) {
    if (k->key != (GKeyFile *)0x0) {
      g_key_file_free();
    }
    g_free(k->name);
    k->key = (GKeyFile *)0x0;
    k->name = (char *)0x0;
    g_free(k);
    return;
  }
  return;
}

Assistant:

void p2sc_free_keyfile(p2sc_keyfile_t *k) {
    if (k) {
        if (k->key)
            g_key_file_free(k->key);
        g_free(k->name);
        memset(k, 0, sizeof *k);
        g_free(k);
    }
}